

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O2

const_iterator __thiscall Json::Value::end(Value *this)

{
  ObjectValues *pOVar1;
  iterator iVar2;
  undefined8 in_RDX;
  bool bVar3;
  const_iterator cVar4;
  
  bVar3 = (*(ushort *)&this->field_0x8 & 0xfe) != 6;
  pOVar1 = (this->value_).map_;
  cVar4.super_ValueIteratorBase._9_7_ = (undefined7)((ulong)in_RDX >> 8);
  cVar4.super_ValueIteratorBase.isNull_ = pOVar1 == (ObjectValues *)0x0 || bVar3;
  iVar2._M_node = (_Base_ptr)0x0;
  if (pOVar1 != (ObjectValues *)0x0 && !bVar3) {
    iVar2._M_node = &(pOVar1->_M_t)._M_impl.super__Rb_tree_header._M_header;
  }
  cVar4.super_ValueIteratorBase.current_._M_node = iVar2._M_node;
  return (const_iterator)cVar4.super_ValueIteratorBase;
}

Assistant:

Value::const_iterator Value::end() const {
  switch (type_) {
  case arrayValue:
  case objectValue:
    if (value_.map_)
      return const_iterator(value_.map_->end());
    break;
  default:
    break;
  }
  return const_iterator();
}